

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TGAImage.cpp
# Opt level: O1

void __thiscall TRM::TGAImage::clearColor(TGAImage *this,TGAColor *c)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  if (this->width != 0) {
    uVar5 = 0;
    do {
      uVar1 = (ulong)(uint)this->height;
      if (this->height != 0) {
        uVar3 = 0;
        do {
          uVar2 = (uint)uVar3;
          uVar4 = (uint)uVar5;
          if ((-1 < (int)(uVar2 | uVar4) && this->data != (uchar *)0x0) &&
             ((int)uVar2 < (int)uVar1 && (int)uVar4 < this->width)) {
            memcpy(this->data + (long)(int)(this->width * uVar2 + uVar4) * (long)this->bytespp,c,
                   (long)this->bytespp);
          }
          uVar3 = uVar3 + 1;
          uVar1 = (ulong)this->height;
        } while (uVar3 < uVar1);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)(long)this->width);
  }
  return;
}

Assistant:

void TGAImage::clearColor(const TGAColor &c) {
  for (size_t i = 0; i < width; i++) {
    for (size_t j = 0; j < height; j++) {
      set(i, j, c);
    }
  }
}